

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

void embree::avx512::InstanceArrayIntersector1::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  long *plVar4;
  long lVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  _func_int *p_Var13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vfloat4 a0_2;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM0 [64];
  vfloat4 a0;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM1 [64];
  undefined4 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM2 [64];
  int iVar35;
  vfloat4 a0_1;
  undefined1 auVar36 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar54;
  float fVar55;
  vfloat4 a1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  RayQueryContext newcontext;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  auVar21 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  a0_1.field_0 = in_ZMM3._0_16_;
  auVar16 = in_ZMM2._0_16_;
  a0_2.field_0 = in_ZMM0._0_16_;
  uVar1 = prim->primID_;
  pGVar2 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var13 = *(_func_int **)&pGVar2->field_0x58;
  if ((((p_Var13 != (_func_int *)0x0) ||
       ((uVar14 = (ulong)*(uint *)(*(long *)&pGVar2[1].time_range.upper +
                                  (long)pGVar2[1].intersectionFilterN * (ulong)uVar1),
        uVar14 != 0xffffffff &&
        (p_Var13 = pGVar2[1].super_RefCount._vptr_RefCount[uVar14], p_Var13 != (_func_int *)0x0))))
      && (((ray->super_RayK<1>).mask & pGVar2->mask) != 0)) &&
     (pRVar3 = context->user, pRVar3->instID[0] == 0xffffffff)) {
    pRVar3->instID[0] = prim->instID_;
    pRVar3->instPrimID[0] = uVar1;
    uVar14 = (ulong)prim->primID_;
    plVar4 = *(long **)&pGVar2[1].fnumTimeSegments;
    iVar35 = (int)plVar4[4];
    if ((pGVar2->field_8).field_0x1 == '\x01') {
      if (iVar35 == 0x9134) {
        lVar5 = *plVar4;
        lVar15 = uVar14 * plVar4[2];
        auVar16 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar15)),
                                ZEXT416(*(uint *)(lVar5 + 0x10 + lVar15)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar16,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar15)),0x28);
        auVar16 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar15)),
                                ZEXT416(*(uint *)(lVar5 + 0x14 + lVar15)),0x1c);
        auVar21 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar15)),0x28);
        auVar16 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar15)),
                                ZEXT416(*(uint *)(lVar5 + 0x18 + lVar15)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar16,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar15)),0x28);
        auVar16 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar15)),
                                ZEXT416(*(uint *)(lVar5 + 0x1c + lVar15)),0x1c);
        auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar15)),0x28);
      }
      else if (iVar35 == 0x9234) {
        lVar5 = *plVar4;
        lVar15 = uVar14 * plVar4[2];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)(lVar5 + 4 + lVar15);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar15);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + lVar15)),_DAT_01fefe80,auVar21);
        auVar21 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0xc + lVar15)),_DAT_01fefe80,auVar18)
        ;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar15);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar15)),_DAT_01fefe80,
                                          auVar20);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar15);
        auVar16 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar15)),_DAT_01fefe80,auVar19
                                    );
      }
      else if (iVar35 == 0xb001) {
        lVar5 = *plVar4;
        lVar15 = uVar14 * plVar4[2];
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar15);
        auVar21 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(lVar5 + 8 + lVar15)),0x20);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar15);
        auVar20 = vpermt2ps_avx512vl(auVar29,_DAT_01fefe90,ZEXT416(*(uint *)(lVar5 + lVar15)));
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar15);
        fVar50 = *(float *)(lVar5 + 0x24 + lVar15);
        fVar54 = *(float *)(lVar5 + 0x28 + lVar15);
        fVar55 = *(float *)(lVar5 + 0x2c + lVar15);
        auVar19 = vpermt2ps_avx512vl(auVar42,_DAT_01fefe90,ZEXT416(*(uint *)(lVar5 + 0x18 + lVar15))
                                    );
        fVar56 = *(float *)(lVar5 + 0x30 + lVar15);
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar54 * fVar54)),ZEXT416((uint)fVar50),
                                  ZEXT416((uint)fVar50));
        auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
        auVar18 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar16._0_4_));
        fVar43 = auVar18._0_4_;
        fVar43 = fVar43 * 1.5 + fVar43 * fVar43 * fVar43 * auVar16._0_4_ * -0.5;
        auVar16 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar43 * fVar50)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar20,ZEXT416((uint)(fVar43 * fVar54)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar21,ZEXT416((uint)(fVar43 * fVar56)),0x30);
        auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar15)),
                                ZEXT416(*(uint *)(lVar5 + 4 + lVar15)),0x10);
        auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar15)),0x20);
        auVar21 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar55 * fVar43)),0x30);
      }
      else if (iVar35 == 0x9244) {
        lVar5 = *plVar4;
        lVar15 = uVar14 * plVar4[2];
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar15))->v;
        auVar21 = *(undefined1 (*) [16])(lVar5 + 0x10 + lVar15);
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x20 + lVar15))->
                        v;
        auVar16 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar15);
      }
      auVar19 = vshufps_avx(auVar16,auVar16,0xff);
      auVar18 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar17 = vshufps_avx(auVar21,auVar21,0xff);
      auVar29 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar20 = vshufps_avx((undefined1  [16])a0.field_0,ZEXT816(0) << 0x40,0xe9);
      auVar20 = vblendps_avx(auVar20,auVar21,4);
      fVar47 = auVar18._0_4_;
      auVar42 = vfmadd213ss_fma(auVar19,auVar19,ZEXT416((uint)(fVar47 * fVar47)));
      auVar42 = vfnmadd231ss_fma(auVar42,auVar17,auVar17);
      auVar30 = vfnmadd231ss_fma(auVar42,auVar29,auVar29);
      fVar43 = auVar19._0_4_;
      auVar22 = ZEXT416((uint)(auVar29._0_4_ * fVar43));
      auVar42 = vfmadd213ss_fma(auVar17,auVar18,auVar22);
      fVar50 = auVar42._0_4_ + auVar42._0_4_;
      auVar38 = ZEXT416((uint)(auVar17._0_4_ * fVar43));
      auVar42 = vfmsub213ss_fma(auVar29,auVar18,auVar38);
      fVar54 = auVar42._0_4_ + auVar42._0_4_;
      auVar42 = vfmsub231ss_fma(auVar22,auVar18,auVar17);
      fVar55 = auVar42._0_4_ + auVar42._0_4_;
      auVar42 = vfmsub231ss_fma(ZEXT416((uint)(fVar47 * fVar47)),auVar19,auVar19);
      auVar19 = vfmadd213ss_avx512f(auVar17,auVar17,auVar42);
      auVar22 = vfnmadd231ss_avx512f(auVar19,auVar29,auVar29);
      auVar19 = vfmadd213ss_avx512f(auVar29,auVar17,ZEXT416((uint)(fVar47 * fVar43)));
      auVar23 = vaddss_avx512f(auVar19,auVar19);
      auVar19 = vfmadd213ss_fma(auVar18,auVar29,auVar38);
      fVar56 = auVar19._0_4_ + auVar19._0_4_;
      auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar47 * fVar43)),auVar17,auVar29);
      fVar43 = auVar19._0_4_ + auVar19._0_4_;
      auVar19 = vfnmadd231ss_fma(auVar42,auVar17,auVar17);
      auVar29 = vfmadd231ss_fma(auVar19,auVar29,auVar29);
      uVar31 = auVar30._0_4_;
      auVar51._4_4_ = uVar31;
      auVar51._0_4_ = uVar31;
      auVar51._8_4_ = uVar31;
      auVar51._12_4_ = uVar31;
      auVar57._4_4_ = fVar50;
      auVar57._0_4_ = fVar50;
      auVar57._8_4_ = fVar50;
      auVar57._12_4_ = fVar50;
      auVar59._0_4_ = fVar54 * 0.0;
      auVar59._4_4_ = fVar54 * 0.0;
      auVar59._8_4_ = fVar54 * 1.0;
      auVar59._12_4_ = fVar54 * 0.0;
      auVar42 = ZEXT816(0x3f80000000000000);
      auVar19 = vfmadd231ps_fma(auVar59,auVar42,auVar57);
      auVar30 = SUB6416(ZEXT464(0x3f800000),0);
      auVar18 = vfmadd231ps_fma(auVar19,auVar30,auVar51);
      auVar52._4_4_ = fVar55;
      auVar52._0_4_ = fVar55;
      auVar52._8_4_ = fVar55;
      auVar52._12_4_ = fVar55;
      auVar19 = vbroadcastss_avx512vl(auVar22);
      auVar17 = vbroadcastss_avx512vl(auVar23);
      auVar58._0_4_ = auVar17._0_4_ * 0.0;
      auVar58._4_4_ = auVar17._4_4_ * 0.0;
      auVar58._8_4_ = auVar17._8_4_ * 1.0;
      auVar58._12_4_ = auVar17._12_4_ * 0.0;
      auVar19 = vfmadd231ps_fma(auVar58,auVar42,auVar19);
      auVar17 = vfmadd231ps_fma(auVar19,auVar30,auVar52);
      auVar48._4_4_ = fVar56;
      auVar48._0_4_ = fVar56;
      auVar48._8_4_ = fVar56;
      auVar48._12_4_ = fVar56;
      auVar45._4_4_ = fVar43;
      auVar45._0_4_ = fVar43;
      auVar45._8_4_ = fVar43;
      auVar45._12_4_ = fVar43;
      fVar50 = auVar29._0_4_;
      auVar53._0_4_ = fVar50 * 0.0;
      auVar53._4_4_ = fVar50 * 0.0;
      auVar53._8_4_ = fVar50 * 1.0;
      auVar53._12_4_ = fVar50 * 0.0;
      auVar19 = vfmadd231ps_fma(auVar53,auVar42,auVar45);
      auVar19 = vfmadd231ps_fma(auVar19,auVar30,auVar48);
      auVar30._0_4_ = a0.field_0._0_4_;
      auVar30._4_4_ = auVar30._0_4_;
      auVar30._8_4_ = auVar30._0_4_;
      auVar30._12_4_ = auVar30._0_4_;
      fVar50 = auVar19._0_4_;
      auVar46._0_4_ = fVar50 * 0.0;
      fVar54 = auVar19._4_4_;
      auVar46._4_4_ = fVar54 * 0.0;
      fVar55 = auVar19._8_4_;
      auVar46._8_4_ = fVar55 * 0.0;
      fVar56 = auVar19._12_4_;
      auVar46._12_4_ = fVar56 * 0.0;
      auVar19 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar17,auVar46);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar19,auVar18,auVar30);
      uVar31 = auVar21._0_4_;
      auVar49._4_4_ = uVar31;
      auVar49._0_4_ = uVar31;
      auVar49._8_4_ = uVar31;
      auVar49._12_4_ = uVar31;
      auVar21 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vfmadd213ps_fma(auVar21,auVar17,auVar46);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar21,auVar18,auVar49);
      iVar35 = a0_1.field_0._0_4_;
      auVar38._4_4_ = iVar35;
      auVar38._0_4_ = iVar35;
      auVar38._8_4_ = iVar35;
      auVar38._12_4_ = iVar35;
      auVar21 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
      auVar19 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
      auVar23._0_4_ = fVar50 * auVar19._0_4_;
      auVar23._4_4_ = fVar54 * auVar19._4_4_;
      auVar23._8_4_ = fVar55 * auVar19._8_4_;
      auVar23._12_4_ = fVar56 * auVar19._12_4_;
      auVar21 = vfmadd231ps_fma(auVar23,auVar17,auVar21);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar21,auVar18,auVar38);
      uVar31 = auVar16._0_4_;
      auVar39._4_4_ = uVar31;
      auVar39._0_4_ = uVar31;
      auVar39._8_4_ = uVar31;
      auVar39._12_4_ = uVar31;
      auVar21 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar22._0_4_ = fVar50 * auVar16._0_4_;
      auVar22._4_4_ = fVar54 * auVar16._4_4_;
      auVar22._8_4_ = fVar55 * auVar16._8_4_;
      auVar22._12_4_ = fVar56 * auVar16._12_4_;
      auVar16 = vfmadd231ps_fma(auVar22,auVar17,auVar21);
      auVar21 = vfmadd231ps_fma(auVar16,auVar18,auVar39);
      auVar16._0_4_ = auVar20._0_4_ + 0.0 + auVar21._0_4_;
      auVar16._4_4_ = auVar20._4_4_ + 0.0 + auVar21._4_4_;
      auVar16._8_4_ = auVar20._8_4_ + 0.0 + auVar21._8_4_;
      auVar16._12_4_ = auVar20._12_4_ + 0.0 + auVar21._12_4_;
    }
    else if (iVar35 == 0x9134) {
      lVar5 = *plVar4;
      lVar15 = uVar14 * plVar4[2];
      auVar16 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar15)),
                              ZEXT416(*(uint *)(lVar5 + 0x10 + lVar15)),0x1c);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar16,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar15)),0x28);
      auVar16 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar15)),
                              ZEXT416(*(uint *)(lVar5 + 0x14 + lVar15)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar16,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar15)),0x28);
      auVar16 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar15)),
                              ZEXT416(*(uint *)(lVar5 + 0x18 + lVar15)),0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar16,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar15)),0x28);
      auVar16 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar15)),
                              ZEXT416(*(uint *)(lVar5 + 0x1c + lVar15)),0x1c);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar15)),0x28);
    }
    else if (iVar35 == 0x9234) {
      lVar5 = *plVar4;
      lVar15 = uVar14 * plVar4[2];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(lVar5 + 4 + lVar15);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar15);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + lVar15)),_DAT_01fefe80,auVar32);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0xc + lVar15)),_DAT_01fefe80,auVar36
                                     );
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar15);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar15)),_DAT_01fefe80,
                                        auVar33);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar15);
      auVar16 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar15)),_DAT_01fefe80,auVar40);
    }
    else if (iVar35 == 0xb001) {
      lVar5 = *plVar4;
      lVar15 = uVar14 * plVar4[2];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar15);
      auVar21 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(lVar5 + 8 + lVar15)),0x20);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar15);
      auVar20 = vpermt2ps_avx512vl(auVar25,_DAT_01fefe90,ZEXT416(*(uint *)(lVar5 + lVar15)));
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar15);
      fVar50 = *(float *)(lVar5 + 0x24 + lVar15);
      fVar54 = *(float *)(lVar5 + 0x28 + lVar15);
      fVar55 = *(float *)(lVar5 + 0x2c + lVar15);
      auVar19 = vpermt2ps_avx512vl(auVar41,_DAT_01fefe90,ZEXT416(*(uint *)(lVar5 + 0x18 + lVar15)));
      fVar56 = *(float *)(lVar5 + 0x30 + lVar15);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar54 * fVar54)),ZEXT416((uint)fVar50),
                                ZEXT416((uint)fVar50));
      auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
      auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
      auVar18 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar16._0_4_));
      fVar43 = auVar18._0_4_;
      fVar43 = fVar43 * 1.5 + fVar43 * fVar43 * fVar43 * auVar16._0_4_ * -0.5;
      auVar16 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar43 * fVar50)),0x30);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar20,ZEXT416((uint)(fVar43 * fVar54)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar21,ZEXT416((uint)(fVar43 * fVar56)),0x30);
      auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar15)),
                              ZEXT416(*(uint *)(lVar5 + 4 + lVar15)),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar15)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar21,ZEXT416((uint)(fVar55 * fVar43)),0x30);
    }
    else if (iVar35 == 0x9244) {
      lVar5 = *plVar4;
      lVar15 = uVar14 * plVar4[2];
      a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar15))->v;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x10 + lVar15))->v;
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x20 + lVar15))->v;
      auVar16 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar15);
    }
    auVar21 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
    auVar20 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
    auVar44._0_4_ = a0_1.field_0._0_4_ * auVar20._0_4_;
    auVar44._4_4_ = a0_1.field_0._4_4_ * auVar20._4_4_;
    auVar44._8_4_ = a0_1.field_0._8_4_ * auVar20._8_4_;
    auVar44._12_4_ = a0_1.field_0._12_4_ * auVar20._12_4_;
    auVar17 = vfmsub231ps_fma(auVar44,(undefined1  [16])a0.field_0,auVar21);
    auVar19 = vshufps_avx(auVar17,auVar17,0xc9);
    auVar18 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xc9);
    auVar37._0_4_ = a0_2.field_0._0_4_ * auVar21._0_4_;
    auVar37._4_4_ = a0_2.field_0._4_4_ * auVar21._4_4_;
    auVar37._8_4_ = a0_2.field_0._8_4_ * auVar21._8_4_;
    auVar37._12_4_ = a0_2.field_0._12_4_ * auVar21._12_4_;
    auVar29 = vfmsub231ps_fma(auVar37,auVar18,(undefined1  [16])a0_1.field_0);
    auVar27._0_4_ = auVar18._0_4_ * a0.field_0._0_4_;
    auVar27._4_4_ = auVar18._4_4_ * a0.field_0._4_4_;
    auVar27._8_4_ = auVar18._8_4_ * a0.field_0._8_4_;
    auVar27._12_4_ = auVar18._12_4_ * a0.field_0._12_4_;
    auVar20 = vfmsub231ps_fma(auVar27,(undefined1  [16])a0_2.field_0,auVar20);
    auVar21 = vshufps_avx(auVar20,auVar20,0xc9);
    auVar18 = vunpcklps_avx(auVar19,auVar21);
    auVar21 = vunpcklps_avx(auVar17,auVar20);
    auVar20 = vinsertps_avx(auVar29,auVar29,0x4a);
    auVar17 = vunpcklps_avx(auVar21,ZEXT416(auVar29._0_4_));
    auVar21 = vdpps_avx((undefined1  [16])a0_2.field_0,auVar19,0x7f);
    auVar29 = vunpcklps_avx(auVar18,auVar20);
    auVar19 = vunpckhps_avx(auVar18,auVar20);
    auVar26._0_4_ = auVar21._0_4_;
    auVar26._4_4_ = auVar26._0_4_;
    auVar26._8_4_ = auVar26._0_4_;
    auVar26._12_4_ = auVar26._0_4_;
    auVar20 = vdivps_avx(auVar29,auVar26);
    auVar19 = vdivps_avx(auVar19,auVar26);
    auVar18 = vdivps_avx(auVar17,auVar26);
    uVar31 = auVar16._0_4_;
    auVar28._4_4_ = uVar31;
    auVar28._0_4_ = uVar31;
    auVar28._8_4_ = uVar31;
    auVar28._12_4_ = uVar31;
    auVar21 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar34._0_4_ = auVar16._0_4_ * auVar18._0_4_;
    auVar34._4_4_ = auVar16._4_4_ * auVar18._4_4_;
    auVar34._8_4_ = auVar16._8_4_ * auVar18._8_4_;
    auVar34._12_4_ = auVar16._12_4_ * auVar18._12_4_;
    auVar16 = vfmadd231ps_fma(auVar34,auVar19,auVar21);
    auVar17 = vfmadd231ps_fma(auVar16,auVar20,auVar28);
    auVar16 = *(undefined1 (*) [16])(ray->super_RayK<1>).org.field_0.m128;
    auVar21 = *(undefined1 (*) [16])(ray->super_RayK<1>).dir.field_0.m128;
    uVar31 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    auVar7._4_4_ = uVar31;
    auVar7._0_4_ = uVar31;
    auVar7._8_4_ = uVar31;
    auVar7._12_4_ = uVar31;
    auVar17 = vfmsub231ps_avx512vl(auVar17,auVar18,auVar7);
    uVar31 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    auVar8._4_4_ = uVar31;
    auVar8._0_4_ = uVar31;
    auVar8._8_4_ = uVar31;
    auVar8._12_4_ = uVar31;
    auVar17 = vfmadd231ps_avx512vl(auVar17,auVar19,auVar8);
    uVar31 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar9._4_4_ = uVar31;
    auVar9._0_4_ = uVar31;
    auVar9._8_4_ = uVar31;
    auVar9._12_4_ = uVar31;
    auVar17 = vfmadd231ps_avx512vl(auVar17,auVar20,auVar9);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar17,auVar16,8);
    (ray->super_RayK<1>).org.field_0 = aVar6;
    uVar31 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
    auVar10._4_4_ = uVar31;
    auVar10._0_4_ = uVar31;
    auVar10._8_4_ = uVar31;
    auVar10._12_4_ = uVar31;
    auVar18 = vmulps_avx512vl(auVar18,auVar10);
    uVar31 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar11._4_4_ = uVar31;
    auVar11._0_4_ = uVar31;
    auVar11._8_4_ = uVar31;
    auVar11._12_4_ = uVar31;
    auVar19 = vfmadd231ps_avx512vl(auVar18,auVar19,auVar11);
    uVar31 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar12._4_4_ = uVar31;
    auVar12._0_4_ = uVar31;
    auVar12._8_4_ = uVar31;
    auVar12._12_4_ = uVar31;
    auVar20 = vfmadd231ps_avx512vl(auVar19,auVar20,auVar12);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar20,auVar21,8);
    (ray->super_RayK<1>).dir.field_0 = aVar6;
    (**(code **)(p_Var13 + 0x78))(p_Var13 + 0x58,ray);
    local_38 = auVar16._0_8_;
    uStack_30 = auVar16._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = local_38;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uStack_30;
    local_48 = auVar21._0_8_;
    uStack_40 = auVar21._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = local_48;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uStack_40;
    pRVar3->instID[0] = 0xffffffff;
    pRVar3->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersector1::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif

      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }